

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

uint16_t __thiscall
xray_re::xr_ogf_v4::motion_io::import_params(motion_io *this,xr_reader *r,uint version)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  xr_motion_marks *this_00;
  reference ppxVar4;
  float fVar5;
  xr_motion_marks *mm;
  xr_motion_marks_vec_it end;
  xr_motion_marks_vec_it it;
  uint16_t motion_id;
  uint version_local;
  xr_reader *r_local;
  motion_io *this_local;
  
  xr_reader::r_sz(r,&(this->super_xr_skl_motion).super_xr_motion.m_name);
  uVar3 = xr_reader::r_u32(r);
  (this->super_xr_skl_motion).m_flags = uVar3;
  uVar2 = xr_reader::r_u16(r);
  (this->super_xr_skl_motion).m_bone_or_part = uVar2;
  uVar2 = xr_reader::r_u16(r);
  fVar5 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_speed = fVar5;
  fVar5 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_power = fVar5;
  fVar5 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_accrue = fVar5;
  fVar5 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_falloff = fVar5;
  if (version == 4) {
    uVar3 = xr_reader::r_u32(r);
    std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::resize
              (&(this->super_xr_skl_motion).m_marks,(ulong)uVar3);
    end._M_current =
         (xr_motion_marks **)
         std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::begin
                   (&(this->super_xr_skl_motion).m_marks);
    mm = (xr_motion_marks *)
         std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::end
                   (&(this->super_xr_skl_motion).m_marks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::xr_motion_marks_**,_std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>_>
                                    *)&mm), bVar1) {
      this_00 = (xr_motion_marks *)operator_new(0x38);
      xr_motion_marks::xr_motion_marks(this_00);
      xr_motion_marks::load(this_00,r);
      ppxVar4 = __gnu_cxx::
                __normal_iterator<xray_re::xr_motion_marks_**,_std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>_>
                ::operator*(&end);
      *ppxVar4 = this_00;
      __gnu_cxx::
      __normal_iterator<xray_re::xr_motion_marks_**,_std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>_>
      ::operator++(&end);
    }
  }
  return uVar2;
}

Assistant:

inline uint16_t xr_ogf_v4::motion_io::import_params(xr_reader& r, unsigned version)
{
	r.r_sz(m_name);
	m_flags = r.r_u32();
	m_bone_or_part = r.r_u16();
	uint16_t motion_id = r.r_u16();
	m_speed = r.r_float();
	m_power = r.r_float();
	m_accrue = r.r_float();
	m_falloff = r.r_float();
	if (version == OGF4_S_SMPARAMS_VERSION_4) {
		m_marks.resize(r.r_u32());
		for (xr_motion_marks_vec_it it = m_marks.begin(), end = m_marks.end(); it != end; ++it) {
			xr_motion_marks* mm = new xr_motion_marks;
			mm->load(r);
			*it = mm;
		}
	}
	return motion_id;
}